

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O1

bool absl::lts_20240722::str_format_internal::ConvertIntArg<absl::lts_20240722::uint128>
               (uint128 v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  IntDigits *pIVar5;
  FormatSinkImpl *pFVar6;
  FormatSinkImpl *sink_00;
  uint uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  string_view v_00;
  FormatConversionSpecImpl conv_02;
  IntDigits as_digits;
  undefined8 local_68;
  uint local_60;
  IntDigits local_58;
  double local_18;
  double dStack_10;
  
  local_60 = conv.precision_;
  pIVar5 = conv._0_8_;
  sink_00 = (FormatSinkImpl *)v.hi_;
  uVar3 = v.lo_;
  conv_00.precision_ = (int)sink;
  local_68 = pIVar5;
  switch(conv.conv_) {
  case 0:
    local_68._2_1_ = conv.length_mod_;
    if (local_68._2_1_ != l) {
      conv_02.precision_ = conv_00.precision_;
      conv_02._0_8_ = pIVar5;
      anon_unknown_53::ConvertCharImpl
                ((char)v.lo_,conv_02,
                 (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),local_60));
      return true;
    }
    conv_00.width_ = 0;
    conv_00.conv_ = (char)local_60;
    conv_00.flags_ = (char)(local_60 >> 8);
    conv_00.length_mod_ = (char)(local_60 >> 0x10);
    conv_00._3_1_ = (char)(local_60 >> 0x18);
    bVar2 = anon_unknown_53::ConvertWCharTImpl
                      ((anon_unknown_53 *)(uVar3 & 0xffffffff),conv._0_4_,conv_00,sink_00);
    return bVar2;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = absl::uint128]"
                 );
  case 2:
  case 3:
  case 5:
  case 0x12:
    anon_unknown_53::IntDigits::PrintAsDec(&local_58,v,false);
    goto LAB_0010a1cd;
  case 4:
    lVar4 = 0;
    pFVar6 = sink_00;
    do {
      do {
        bVar1 = (byte)uVar3;
        uVar3 = uVar3 >> 3 | (long)pFVar6 << 0x3d;
        local_58.storage_[lVar4 + 0x2b] = bVar1 & 7 | 0x30;
        sink_00 = (FormatSinkImpl *)((ulong)pFVar6 >> 3);
        lVar4 = lVar4 + -1;
        bVar2 = (FormatSinkImpl *)0x7 < pFVar6;
        pFVar6 = sink_00;
      } while (bVar2);
    } while (uVar3 != 0);
    break;
  case 6:
    anon_unknown_53::IntDigits::PrintAsHexLower<absl::lts_20240722::uint128>(&local_58,v);
    goto LAB_0010a1cd;
  case 7:
    lVar4 = 0;
    pFVar6 = sink_00;
    do {
      do {
        uVar7 = (uint)uVar3;
        uVar3 = uVar3 >> 4 | (long)pFVar6 << 0x3c;
        local_58.storage_[lVar4 + 0x2b] = "0123456789ABCDEF"[uVar7 & 0xf];
        sink_00 = (FormatSinkImpl *)((ulong)pFVar6 >> 4);
        lVar4 = lVar4 + -1;
        bVar2 = (FormatSinkImpl *)0xf < pFVar6;
        pFVar6 = sink_00;
      } while (bVar2);
    } while (uVar3 != 0);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    auVar9._8_4_ = v.lo_._4_4_;
    auVar9._0_8_ = uVar3;
    auVar9._12_4_ = 0x45300000;
    dStack_10 = auVar9._8_8_ - 1.9342813113834067e+25;
    local_18 = dStack_10 + ((double)CONCAT44(0x43300000,(int)v.lo_) - 4503599627370496.0);
    auVar10._8_4_ = v.hi_._4_4_;
    auVar10._0_8_ = sink_00;
    auVar10._12_4_ = 0x45300000;
    dVar8 = ldexp((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)v.hi_) - 4503599627370496.0),0x40);
    bVar2 = ConvertFloatImpl(dVar8 + local_18,(FormatConversionSpecImpl *)&local_68,sink);
    return bVar2;
  }
  local_58.start_ = local_58.storage_ + lVar4 + 0x2c;
  local_58.size_ = -lVar4;
LAB_0010a1cd:
  if (local_68._1_1_ == kBasic) {
    v_00._M_str = local_58.start_;
    v_00._M_len = local_58.size_;
    FormatSinkImpl::Append(sink,v_00);
  }
  else {
    conv_01.width_ = 0;
    conv_01.conv_ = (undefined1)local_60;
    conv_01.flags_ = local_60._1_1_;
    conv_01.length_mod_ = local_60._2_1_;
    conv_01._3_1_ = local_60._3_1_;
    conv_01.precision_ = conv_00.precision_;
    anon_unknown_53::ConvertIntImplInnerSlow((anon_unknown_53 *)&local_58,local_68,conv_01,sink_00);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}